

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O1

void __thiscall
QAbstractItemViewPrivate::disconnectDelegate
          (QAbstractItemViewPrivate *this,QAbstractItemDelegate *delegate)

{
  QObject *pQVar1;
  long in_FS_OFFSET;
  code *local_58;
  undefined8 local_50;
  code *local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (delegate != (QAbstractItemDelegate *)0x0) {
    pQVar1 = *(QObject **)
              &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
               field_0x8;
    local_48 = QAbstractItemDelegate::closeEditor;
    local_40 = 0;
    local_58 = (code *)0x291;
    local_50 = 0;
    QObject::disconnectImpl
              (&delegate->super_QObject,&local_48,pQVar1,&local_58,
               &QAbstractItemDelegate::staticMetaObject);
    local_48 = QAbstractItemDelegate::commitData;
    local_40 = 0;
    local_58 = (code *)0x299;
    local_50 = 0;
    QObject::disconnectImpl
              (&delegate->super_QObject,&local_48,pQVar1,&local_58,
               &QAbstractItemDelegate::staticMetaObject);
    local_48 = QAbstractItemDelegate::sizeHintChanged;
    local_40 = 0;
    local_58 = delegateSizeHintChanged;
    local_50 = 0;
    QObject::disconnectImpl
              (&delegate->super_QObject,&local_48,
               *(QObject **)
                &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
                 field_0x8,&local_58,&QAbstractItemDelegate::staticMetaObject);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemViewPrivate::disconnectDelegate(QAbstractItemDelegate *delegate)
{
    if (!delegate)
        return;
    Q_Q(QAbstractItemView);
    QObject::disconnect(delegate, &QAbstractItemDelegate::closeEditor,
                        q, &QAbstractItemView::closeEditor);
    QObject::disconnect(delegate, &QAbstractItemDelegate::commitData,
                        q, &QAbstractItemView::commitData);
    QObjectPrivate::disconnect(delegate, &QAbstractItemDelegate::sizeHintChanged,
                               this, &QAbstractItemViewPrivate::delegateSizeHintChanged);
}